

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::import_from_file(NaVector *this,char *szFilePath)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  undefined8 *puVar6;
  char *in_RSI;
  long *in_RDI;
  NaReal fVal;
  uint i;
  uint n;
  FILE *fp;
  undefined8 local_28;
  uint local_20;
  undefined4 local_1c;
  FILE *local_18;
  
  if (in_RSI == (char *)0x0) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 0;
    __cxa_throw(puVar5,&NaException::typeinfo,0);
  }
  local_18 = fopen(in_RSI,"rt");
  if (local_18 == (FILE *)0x0) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 5;
    __cxa_throw(puVar5,&NaException::typeinfo,0);
  }
  iVar3 = __isoc99_fscanf(local_18,"%u\n",&local_1c);
  if (iVar3 != 1) {
    puVar5 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar5 = 7;
    __cxa_throw(puVar5,&NaException::typeinfo,0);
  }
  (**(code **)(*in_RDI + 0x20))(in_RDI,local_1c);
  local_20 = 0;
  while( true ) {
    uVar2 = local_20;
    uVar4 = (**(code **)(*in_RDI + 0x30))();
    if (uVar4 <= uVar2) {
      fclose(local_18);
      return;
    }
    iVar3 = __isoc99_fscanf(local_18,"%lg",&local_28);
    uVar1 = local_28;
    if (iVar3 != 1) break;
    puVar6 = (undefined8 *)(**(code **)(*in_RDI + 0x38))(in_RDI,local_20);
    *puVar6 = uVar1;
    local_20 = local_20 + 1;
  }
  puVar5 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar5 = 7;
  __cxa_throw(puVar5,&NaException::typeinfo,0);
}

Assistant:

void
NaVector::import_from_file (const char* szFilePath)
{
    if(NULL == szFilePath)
        throw(na_null_pointer);

    FILE    *fp = fopen(szFilePath, "rt"); // rt
    if(NULL == fp)
        throw(na_cant_open_file);

    unsigned    n;
    if(1 != fscanf(fp, "%u\n", &n))
        throw(na_read_error);

    new_dim(n);

    unsigned    i;
    for(i = 0; i < dim(); ++i){
        NaReal  fVal;
        if(1 != fscanf(fp, "%lg", &fVal))
            throw(na_read_error);
        fetch(i) = fVal;
    }

    fclose(fp);
}